

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateFastInlineStringSplitMatch(Lowerer *this,Instr *instr)

{
  LowererMD *this_00;
  undefined2 valueType;
  Opnd *newDst;
  Opnd *this_01;
  Instr *argoutInlineSpecialized;
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  RegOpnd *pRVar7;
  Opnd *compareSrc2;
  Lowerer *pLVar8;
  IndirOpnd *compareSrc1;
  Instr *this_02;
  BailOutInfo *bailoutInfo;
  HelperCallOpnd *pHVar9;
  IntConstOpnd *opndArg;
  LabelInstr *target;
  JnHelperMethod helperMethod;
  undefined1 local_70 [8];
  AutoReuseOpnd autoReuseStackAllocationOpnd;
  LowererMD *local_48;
  Opnd *argsOpnd [2];
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x501e,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar2) goto LAB_0054af38;
    *puVar4 = 0;
  }
  newDst = instr->m_dst;
  this_01 = instr->m_src1;
  pSVar5 = IR::Opnd::AsSymOpnd(instr->m_src2);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  argoutInlineSpecialized = (pSVar6->field_5).m_instrDef;
  bVar2 = IR::Instr::FetchOperands(instr,(Opnd **)&local_48,2);
  if (bVar2) {
    local_70._0_2_ = ((ValueType *)&local_48->m_func)->field_0;
    bVar2 = ValueType::IsLikelyString((ValueType *)local_70);
    if (bVar2) {
      bVar2 = IR::Opnd::IsTaggedInt(argsOpnd[0]);
      if (!bVar2) {
        argsOpnd[1] = (Opnd *)IR::LabelInstr::New(Label,this->m_func,true);
        pLVar8 = (Lowerer *)local_70;
        local_70._0_2_ = (((ValueType *)&local_48->m_func)->field_0).bits;
        bVar2 = ValueType::IsString((ValueType *)pLVar8);
        if (!bVar2) {
          local_48 = (LowererMD *)GetRegOpnd(pLVar8,(Opnd *)local_48,instr,this->m_func,TyVar);
          pRVar7 = IR::Opnd::AsRegOpnd((Opnd *)local_48);
          GenerateStringTest(this,pRVar7,instr,(LabelInstr *)argsOpnd[1],(LabelInstr *)0x0,true);
        }
        bVar2 = IR::Opnd::IsNotTaggedValue(argsOpnd[0]);
        if (!bVar2) {
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,argsOpnd[0],instr,(LabelInstr *)argsOpnd[1],false);
        }
        pLVar8 = this;
        compareSrc2 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
        argsOpnd[0] = &GetRegOpnd(pLVar8,argsOpnd[0],instr,this->m_func,TyVar)->super_Opnd;
        pLVar8 = (Lowerer *)IR::Opnd::AsRegOpnd(argsOpnd[0]);
        compareSrc1 = IR::IndirOpnd::New((RegOpnd *)pLVar8,0,TyUint64,instr->m_func,false);
        InsertCompareBranch(pLVar8,&compareSrc1->super_Opnd,compareSrc2,BrNeq_A,
                            (LabelInstr *)argsOpnd[1],instr,false);
        this_02 = IR::Instr::New(CALL,instr->m_func);
        if (newDst != (Opnd *)0x0) {
          IR::Instr::SetDst(this_02,newDst);
        }
        IR::Instr::InsertBefore(instr,this_02);
        if ((instr->field_0x38 & 0x10) != 0) {
          BVar3 = IR::Instr::GetBailOutKind(instr);
          if ((BVar3 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls) {
            bailoutInfo = IR::Instr::GetBailOutInfo(instr);
            BVar3 = IR::Instr::GetBailOutKind(instr);
            this_02 = AddBailoutToHelperCallInstr(this,this_02,bailoutInfo,BVar3,instr);
          }
        }
        pHVar9 = IR::Opnd::AsHelperCallOpnd(this_01);
        if (pHVar9->m_fnHelper == HelperString_Split) {
          opndArg = IR::IntConstOpnd::New(0xffffffff,TyUint32,instr->m_func,false);
          LowererMD::LoadHelperArgument(&this->m_lowererMD,this_02,&opndArg->super_Opnd);
        }
        this_00 = &this->m_lowererMD;
        LowererMD::LoadHelperArgument(this_00,this_02,(Opnd *)local_48);
        autoReuseStackAllocationOpnd._16_8_ = this_00;
        LowererMD::LoadHelperArgument(this_00,this_02,argsOpnd[0]);
        LoadScriptContext(this,this_02);
        local_70 = (undefined1  [8])0x0;
        autoReuseStackAllocationOpnd.func._1_1_ = 1;
        if ((newDst == (Opnd *)0x0) || ((instr->field_0x36 & 8) == 0)) {
          pHVar9 = IR::Opnd::AsHelperCallOpnd(this_01);
          if (pHVar9->m_fnHelper == HelperString_Match) {
            helperMethod = (uint)(newDst == (Opnd *)0x0) * 2 + HelperRegExp_MatchResultUsed;
          }
          else if (pHVar9->m_fnHelper == HelperString_Split) {
            helperMethod = (uint)(newDst == (Opnd *)0x0) * 2 + HelperRegExp_SplitResultUsed;
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x5093,"(false)","false");
            if (!bVar2) {
LAB_0054af38:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar4 = 0;
            helperMethod = HelperInvalid;
          }
        }
        else {
          pHVar9 = IR::Opnd::AsHelperCallOpnd(this_01);
          if (pHVar9->m_fnHelper == HelperString_Match) {
            helperMethod = HelperRegExp_MatchResultUsedAndMayBeTemp;
          }
          else {
            helperMethod = HelperRegExp_SplitResultUsedAndMayBeTemp;
            if (pHVar9->m_fnHelper != HelperString_Split) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x5075,"(false)","false");
              if (!bVar2) goto LAB_0054af38;
              *puVar4 = 0;
              helperMethod = HelperInvalid;
            }
          }
          pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)local_70,&pRVar7->super_Opnd,this->m_func,true);
          valueType = newDst->m_valueType;
          IR::Opnd::SetValueType(&pRVar7->super_Opnd,(ValueType)valueType);
          GenerateMarkTempAlloc(this,pRVar7,Js::JavascriptArray::StackAllocationSize,this_02);
          LowererMD::LoadHelperArgument
                    ((LowererMD *)autoReuseStackAllocationOpnd._16_8_,this_02,&pRVar7->super_Opnd);
        }
        LowererMD::ChangeToHelperCall
                  ((LowererMD *)autoReuseStackAllocationOpnd._16_8_,this_02,helperMethod,
                   (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
        target = IR::LabelInstr::New(Label,this->m_func,false);
        IR::Instr::InsertAfter(instr,&target->super_Instr);
        IR::Instr::InsertBefore(instr,(Instr *)argsOpnd[1]);
        pLVar8 = (Lowerer *)0x9;
        InsertBranch(Br,true,target,(Instr *)argsOpnd[1]);
        RelocateCallDirectToHelperPath(pLVar8,argoutInlineSpecialized,(LabelInstr *)argsOpnd[1]);
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_70);
      }
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineStringSplitMatch(IR::Instr * instr)
{
    // a.split(b,c (optional) )
    // We want to emit the fast path when
    //     1. c is not present, and
    //     2. 'a' is a string and 'b' is a regex.
    //
    // a.match(b)
    // We want to emit the fast path when 'a' is a string and 'b' is a regex.

    Assert(instr->m_opcode == Js::OpCode::CallDirect);
    IR::Opnd * callDst = instr->GetDst();

    //helperCallOpnd
    IR::Opnd * src1 = instr->GetSrc1();

    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = instr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2];
    if(!instr->FetchOperands(argsOpnd, 2))
    {
        return;
    }

    if(!argsOpnd[0]->GetValueType().IsLikelyString() || argsOpnd[1]->IsTaggedInt())
    {
        return;
    }

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    if(!argsOpnd[0]->GetValueType().IsString())
    {
        argsOpnd[0] = GetRegOpnd(argsOpnd[0], instr, m_func, TyVar);
        this->GenerateStringTest(argsOpnd[0]->AsRegOpnd(), instr, labelHelper);
    }

    if(!argsOpnd[1]->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(argsOpnd[1], instr, labelHelper);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    // cmp  [regex], vtableAddress
    // jne  $labelHelper
    argsOpnd[1] = GetRegOpnd(argsOpnd[1], instr, m_func, TyVar);
    InsertCompareBranch(
        IR::IndirOpnd::New(argsOpnd[1]->AsRegOpnd(), 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        labelHelper,
        instr);

    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    if (callDst)
    {
        helperCallInstr->SetDst(callDst);
    }
    instr->InsertBefore(helperCallInstr);
    if (instr->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()))
    {
        helperCallInstr = AddBailoutToHelperCallInstr(helperCallInstr, instr->GetBailOutInfo(), instr->GetBailOutKind(), instr);
    }

    // [stackAllocationPointer, ]scriptcontext, regexp, input[, limit] (to be pushed in reverse order)

    if(src1->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperString_Split)
    {
        //limit
        //As we are optimizing only for two operands, make limit UINT_MAX
        IR::Opnd* limit = IR::IntConstOpnd::New(UINT_MAX, TyUint32, instr->m_func);
        this->m_lowererMD.LoadHelperArgument(helperCallInstr, limit);
    }

    //input, regexp
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, argsOpnd[0]);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, argsOpnd[1]);

    // script context
    LoadScriptContext(helperCallInstr);

    IR::JnHelperMethod helperMethod = IR::JnHelperMethod::HelperInvalid;
    IR::AutoReuseOpnd autoReuseStackAllocationOpnd;
    if(callDst && instr->dstIsTempObject)
    {
        switch(src1->AsHelperCallOpnd()->m_fnHelper)
        {
            case IR::JnHelperMethod::HelperString_Split:
                helperMethod = IR::JnHelperMethod::HelperRegExp_SplitResultUsedAndMayBeTemp;
                break;

            case IR::JnHelperMethod::HelperString_Match:
                helperMethod = IR::JnHelperMethod::HelperRegExp_MatchResultUsedAndMayBeTemp;
                break;

            default:
                Assert(false);
                __assume(false);
        }

        // Allocate some space on the stack for the result array
        IR::RegOpnd *const stackAllocationOpnd = IR::RegOpnd::New(TyVar, m_func);
        autoReuseStackAllocationOpnd.Initialize(stackAllocationOpnd, m_func);
        stackAllocationOpnd->SetValueType(callDst->GetValueType());
        GenerateMarkTempAlloc(stackAllocationOpnd, Js::JavascriptArray::StackAllocationSize, helperCallInstr);
        m_lowererMD.LoadHelperArgument(helperCallInstr, stackAllocationOpnd);
    }
    else
    {
        switch(src1->AsHelperCallOpnd()->m_fnHelper)
        {
            case IR::JnHelperMethod::HelperString_Split:
                helperMethod =
                    callDst
                        ? IR::JnHelperMethod::HelperRegExp_SplitResultUsed
                        : IR::JnHelperMethod::HelperRegExp_SplitResultNotUsed;
                break;

            case IR::JnHelperMethod::HelperString_Match:
                helperMethod =
                    callDst
                        ? IR::JnHelperMethod::HelperRegExp_MatchResultUsed
                        : IR::JnHelperMethod::HelperRegExp_MatchResultNotUsed;
                break;

            default:
                Assert(false);
                __assume(false);
        }
    }

    m_lowererMD.ChangeToHelperCall(helperCallInstr, helperMethod);

    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr->InsertAfter(doneLabel);
    instr->InsertBefore(labelHelper);
    InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
}